

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cc
# Opt level: O0

BinarySectionOrder wabt::GetSectionOrder(BinarySection sec)

{
  BinarySectionOrder local_c;
  BinarySection sec_local;
  
  switch(sec) {
  case Custom:
    local_c = Custom;
    break;
  case Type:
    local_c = Type;
    break;
  case Import:
    local_c = Import;
    break;
  case Function:
    local_c = Function;
    break;
  case Table:
    local_c = Table;
    break;
  case Memory:
    local_c = Memory;
    break;
  case Global:
    local_c = Global;
    break;
  case Export:
    local_c = Export;
    break;
  case Start:
    local_c = Start;
    break;
  case Elem:
    local_c = Elem;
    break;
  case Code:
    local_c = Code;
    break;
  case Data:
    local_c = Data;
    break;
  case DataCount:
    local_c = DataCount;
    break;
  case Last:
    local_c = Tag;
    break;
  default:
    abort();
  }
  return local_c;
}

Assistant:

BinarySectionOrder GetSectionOrder(BinarySection sec) {
  switch (sec) {
#define V(Name, name, code) \
  case BinarySection::Name: \
    return BinarySectionOrder::Name;
    WABT_FOREACH_BINARY_SECTION(V)
#undef V
    default:
      WABT_UNREACHABLE;
  }
}